

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O3

PackedColor Imath_2_5::rgb2packed<unsigned_char>(Color4<unsigned_char> *c)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar8;
  float fVar9;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar10;
  undefined1 auVar7 [16];
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [16];
  
  uVar1._0_1_ = c->b;
  uVar1._1_1_ = c->a;
  auVar5._0_4_ = (float)(uVar1 & 0xff);
  auVar5._4_4_ = (float)(byte)uVar1._1_1_;
  auVar5._8_8_ = 0;
  auVar6 = divps(auVar5,_DAT_00161a10);
  fVar4 = auVar6._0_4_ * (float)DAT_00161a10;
  fVar8 = auVar6._4_4_ * DAT_00161a10._4_4_;
  fVar9 = auVar6._8_4_ * DAT_00161a10._8_4_;
  fVar10 = auVar6._12_4_ * DAT_00161a10._12_4_;
  iVar2 = (int)fVar4;
  iVar3 = (int)fVar8;
  uVar11 = (undefined1)((uint)iVar3 >> 8);
  uVar12 = (undefined1)((uint)iVar3 >> 0x10);
  uVar13 = (undefined1)((uint)iVar3 >> 0x18);
  iVar14 = (int)fVar9;
  iVar15 = (int)fVar10;
  auVar16._0_4_ = iVar2 >> 0x1f;
  auVar16._4_4_ =
       (int)((long)CONCAT17(uVar13,CONCAT16(uVar12,CONCAT15(uVar11,CONCAT14((char)iVar3,iVar2)))) >>
            0x3f);
  auVar16._8_4_ = iVar14 >> 0x1f;
  auVar16._12_4_ = iVar15 >> 0x1f;
  auVar7._0_4_ = (int)(fVar4 - 2.1474836e+09);
  auVar7._4_4_ = (int)(fVar8 - 2.1474836e+09);
  auVar7._8_4_ = (int)(fVar9 - 2.1474836e+09);
  auVar7._12_4_ = (int)(fVar10 - 2.1474836e+09);
  auVar6[4] = (char)iVar3;
  auVar6._0_4_ = iVar2;
  auVar6[5] = uVar11;
  auVar6[6] = uVar12;
  auVar6[7] = uVar13;
  auVar6._8_4_ = iVar14;
  auVar6._12_4_ = iVar15;
  auVar6 = auVar7 & auVar16 | auVar6;
  return (uint)auVar6[4] << 0x18 |
         auVar6._0_4_ << 0x10 |
         (int)(long)(((float)c->g / 255.0) * 255.0) << 8 |
         (uint)(long)(((float)c->r / 255.0) * 255.0);
}

Assistant:

PackedColor
rgb2packed(const Color4<T> &c)
{
    if ( limits<T>::isIntegral() )
    {
	float r = c.r / float(limits<T>::max());
	float g = c.g / float(limits<T>::max());
	float b = c.b / float(limits<T>::max());
	float a = c.a / float(limits<T>::max());
	return rgb2packed( C4f(r,g,b,a) );
    }
    else
    {
	return (  (PackedColor) (c.r * 255)		|
		(((PackedColor) (c.g * 255)) << 8)	|
		(((PackedColor) (c.b * 255)) << 16)	|
		(((PackedColor) (c.a * 255)) << 24));
    }
}